

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.h
# Opt level: O0

int get_pred_buffer(PRED_BUFFER *p,int len)

{
  int buf_idx;
  int len_local;
  PRED_BUFFER *p_local;
  
  buf_idx = 0;
  while( true ) {
    if (len <= buf_idx) {
      return -1;
    }
    if (p[buf_idx].in_use == 0) break;
    buf_idx = buf_idx + 1;
  }
  p[buf_idx].in_use = 1;
  return buf_idx;
}

Assistant:

static inline int get_pred_buffer(PRED_BUFFER *p, int len) {
  for (int buf_idx = 0; buf_idx < len; buf_idx++) {
    if (!p[buf_idx].in_use) {
      p[buf_idx].in_use = 1;
      return buf_idx;
    }
  }
  return -1;
}